

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall mp::BasicSolver::set_warn_cb(BasicSolver *this,AMPLS_Warning_Callback_T cb)

{
  _Any_data __tmp;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type p_Stack_10;
  
  local_28._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(this->warn_cb_).super__Function_base._M_functor;
  local_28._8_8_ = *(undefined8 *)((long)&(this->warn_cb_).super__Function_base._M_functor + 8);
  *(AMPLS_Warning_Callback_T *)&(this->warn_cb_).super__Function_base._M_functor = cb;
  *(undefined8 *)((long)&(this->warn_cb_).super__Function_base._M_functor + 8) = 0;
  local_18 = (this->warn_cb_).super__Function_base._M_manager;
  p_Stack_10 = (this->warn_cb_)._M_invoker;
  (this->warn_cb_).super__Function_base._M_manager =
       std::
       _Function_handler<std::pair<const_char_*,_const_char_*>_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/src/solver.cc:777:14)>
       ::_M_manager;
  (this->warn_cb_)._M_invoker =
       std::
       _Function_handler<std::pair<const_char_*,_const_char_*>_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/src/solver.cc:777:14)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void BasicSolver::set_warn_cb(AMPLS_Warning_Callback_T cb) {
  assert(cb);
  warn_cb_ = [cb](const char* info) {
    const char *wt=0, *wd=0;
    cb(info, &wt, &wd);
    return std::pair {wt, wd};
  };
}